

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegExecCtxtPtr xmlRegNewExecCtxt(xmlRegexpPtr comp,xmlRegExecCallbacks callback,void *data)

{
  void *pvVar1;
  xmlRegExecCtxtPtr exec;
  void *data_local;
  xmlRegExecCallbacks callback_local;
  xmlRegexpPtr comp_local;
  
  if (comp == (xmlRegexpPtr)0x0) {
    comp_local = (xmlRegexpPtr)0x0;
  }
  else if ((comp->compact == (int *)0x0) && (comp->states == (xmlRegStatePtr *)0x0)) {
    comp_local = (xmlRegexpPtr)0x0;
  }
  else {
    comp_local = (xmlRegexpPtr)(*xmlMalloc)(0x98);
    if (comp_local == (xmlRegexpPtr)0x0) {
      comp_local = (xmlRegexpPtr)0x0;
    }
    else {
      memset(comp_local,0,0x98);
      comp_local->stringMap = (xmlChar **)0x0;
      *(undefined4 *)&comp_local->transdata = 0;
      *(undefined4 *)((long)&comp_local->string + 4) = 1;
      *(undefined4 *)&comp_local->counters = 0;
      *(undefined4 *)((long)&comp_local->counters + 4) = 0;
      comp_local->determinist = 0;
      comp_local->flags = 0;
      *(undefined4 *)&comp_local->string = 0;
      *(xmlRegexpPtr *)&comp_local->nbStates = comp;
      if (comp->compact == (int *)0x0) {
        comp_local->atoms = (xmlRegAtomPtr *)*comp->states;
      }
      comp_local->nbCounters = 0;
      *(undefined4 *)&comp_local->field_0x2c = 0;
      comp_local->states = (xmlRegStatePtr *)callback;
      *(void **)&comp_local->nbAtoms = data;
      if (comp->nbCounters < 1) {
        *(undefined8 *)&comp_local->nbstates = 0;
        comp_local[1].atoms = (xmlRegAtomPtr *)0x0;
      }
      else {
        pvVar1 = (*xmlMalloc)((long)comp->nbCounters << 3);
        *(void **)&comp_local->nbstates = pvVar1;
        if (*(long *)&comp_local->nbstates == 0) {
          (*xmlFree)(comp_local);
          return (xmlRegExecCtxtPtr)0x0;
        }
        memset(*(void **)&comp_local->nbstates,0,(long)comp->nbCounters << 3);
        comp_local[1].atoms =
             (xmlRegAtomPtr *)(*(long *)&comp_local->nbstates + (long)comp->nbCounters * 4);
      }
      *(undefined4 *)&comp_local->compact = 0;
      *(undefined4 *)((long)&comp_local->compact + 4) = 0;
      comp_local[1].string = (xmlChar *)0x0;
      comp_local[1].nbStates = -1;
      *(undefined8 *)&comp_local[1].nbAtoms = 0;
      comp_local[1].nbCounters = 0;
    }
  }
  return (xmlRegExecCtxtPtr)comp_local;
}

Assistant:

xmlRegExecCtxtPtr
xmlRegNewExecCtxt(xmlRegexpPtr comp, xmlRegExecCallbacks callback, void *data) {
    xmlRegExecCtxtPtr exec;

    if (comp == NULL)
	return(NULL);
    if ((comp->compact == NULL) && (comp->states == NULL))
        return(NULL);
    exec = (xmlRegExecCtxtPtr) xmlMalloc(sizeof(xmlRegExecCtxt));
    if (exec == NULL)
	return(NULL);
    memset(exec, 0, sizeof(xmlRegExecCtxt));
    exec->inputString = NULL;
    exec->index = 0;
    exec->determinist = 1;
    exec->maxRollbacks = 0;
    exec->nbRollbacks = 0;
    exec->rollbacks = NULL;
    exec->status = XML_REGEXP_OK;
    exec->comp = comp;
    if (comp->compact == NULL)
	exec->state = comp->states[0];
    exec->transno = 0;
    exec->transcount = 0;
    exec->callback = callback;
    exec->data = data;
    if (comp->nbCounters > 0) {
        /*
	 * For error handling, exec->counts is allocated twice the size
	 * the second half is used to store the data in case of rollback
	 */
	exec->counts = (int *) xmlMalloc(comp->nbCounters * sizeof(int)
	                                 * 2);
	if (exec->counts == NULL) {
	    xmlFree(exec);
	    return(NULL);
	}
        memset(exec->counts, 0, comp->nbCounters * sizeof(int) * 2);
	exec->errCounts = &exec->counts[comp->nbCounters];
    } else {
	exec->counts = NULL;
	exec->errCounts = NULL;
    }
    exec->inputStackMax = 0;
    exec->inputStackNr = 0;
    exec->inputStack = NULL;
    exec->errStateNo = -1;
    exec->errString = NULL;
    exec->nbPush = 0;
    return(exec);
}